

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool qt_try_modal(QWidget *widget,Type type)

{
  bool bVar1;
  QWidget *pQVar2;
  int in_ESI;
  int __sig;
  long in_FS_OFFSET;
  bool block_event;
  QWidget *top;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  byte bVar3;
  bool local_11;
  QWidget *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QWidget *)0x0;
  __sig = (int)&local_10;
  bVar1 = QApplicationPrivate::tryModalHelper
                    ((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                     (QWidget **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    local_11 = true;
  }
  else {
    bVar3 = 0;
    if ((in_ESI - 2U < 2) || (in_ESI - 5U < 3)) {
      bVar3 = 1;
    }
    if (((bVar3 != 0) && (local_10 != (QWidget *)0x0)) &&
       (pQVar2 = QWidget::parentWidget((QWidget *)0x2cfa8b), pQVar2 == (QWidget *)0x0)) {
      QWidget::raise(local_10,__sig);
    }
    local_11 = (bool)((bVar3 ^ 0xff) & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

bool qt_try_modal(QWidget *widget, QEvent::Type type)
{
    QWidget * top = nullptr;

    if (QApplicationPrivate::tryModalHelper(widget, &top))
        return true;

    bool block_event  = false;

    switch (type) {
    case QEvent::MouseButtonPress:                        // disallow mouse/key events
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
    case QEvent::KeyPress:
    case QEvent::KeyRelease:
        block_event         = true;
        break;
    default:
        break;
    }

    if (block_event && top && top->parentWidget() == nullptr)
        top->raise();

    return !block_event;
}